

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SpanTest_CtorFromPtrAndSize_Test::TestBody
          (SpanTest_CtorFromPtrAndSize_Test *this)

{
  int *ptr;
  size_t in_R8;
  initializer_list<int> __l;
  Span<int> s;
  allocator_type local_31;
  vector<int,_std::allocator<int>_> v;
  int local_18 [4];
  
  local_18[0] = 7;
  local_18[1] = 8;
  local_18[2] = 9;
  local_18[3] = 10;
  __l._M_len = 4;
  __l._M_array = local_18;
  std::vector<int,_std::allocator<int>_>::vector(&v,__l,&local_31);
  ptr = (int *)((long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2);
  s.size_ = (size_t)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
  s.data_ = ptr;
  TestCtor((anon_unknown_0 *)
           v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start,
           s,ptr,in_R8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST(SpanTest, CtorFromPtrAndSize) {
  std::vector<int> v = {7, 8, 9, 10};
  Span<int> s(v.data(), v.size());
  TestCtor(s, v.data(), v.size());
}